

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::printer_internal::formatter::BiggestIntPrinter::Print
               (BiggestInt value,iu_ostream *os)

{
  iu_ostream *os_local;
  BiggestInt value_local;
  
  std::ostream::operator<<(os,value);
  return;
}

Assistant:

static void Print(BiggestInt value, iu_ostream* os)
    {
#if IUTEST_HAS_BIGGESTINT_OSTREAM
        *os << value;
#else
        const Int32 v = value;
        *os << v;
#endif
    }